

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O2

void Cipher::printPlain(vector<int,_std::allocator<int>_> *t)

{
  uint uVar1;
  pointer piVar2;
  uint uVar3;
  uint __c;
  int i;
  long lVar4;
  
  for (lVar4 = 0;
      piVar2 = (t->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start,
      lVar4 < (int)((ulong)((long)(t->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar2) >> 2);
      lVar4 = lVar4 + 1) {
    uVar1 = piVar2[lVar4];
    uVar3 = 0x5f;
    if (uVar1 != 0x1b) {
      uVar3 = 0x2e;
    }
    __c = uVar1 | 0x60;
    if (0x19 < uVar1 - 1) {
      __c = uVar3;
    }
    putchar(__c);
  }
  return;
}

Assistant:

void printPlain(const std::vector<TLetter> & t) {
        for (int i = 0; i < (int) t.size(); ++i) {
            const auto let = t[i];

            if (let >= 1 && let <= 26) {
                printf("%c", 'a' + let - 1);
            } else if (let == 27) {
                printf("_");
            } else {
                printf(".");
            }
        }
    }